

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# canvas_primitives.cpp
# Opt level: O0

string * __thiscall
editor::figures::Rectangle::get_representation_abi_cxx11_
          (string *__return_storage_ptr__,Rectangle *this)

{
  ostream *poVar1;
  stringstream local_1a0 [8];
  stringstream ss;
  ostream local_190 [376];
  Rectangle *local_18;
  Rectangle *this_local;
  
  local_18 = this;
  this_local = (Rectangle *)__return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1a0);
  poVar1 = std::operator<<(local_190,"rectangle, left top: (");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(this->left_top).x);
  poVar1 = std::operator<<(poVar1,",");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(this->left_top).y);
  poVar1 = std::operator<<(poVar1,"), right bottom: (");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(this->right_bottom).x);
  poVar1 = std::operator<<(poVar1,",");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(this->right_bottom).y);
  std::operator<<(poVar1,")");
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

std::string Rectangle::get_representation() {
        std::stringstream ss;
        ss << "rectangle, left top: ("
                  << left_top.x << "," << left_top.y << "), right bottom: ("
                  << right_bottom.x << "," << right_bottom.y << ")";
        return ss.str();
    }